

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

void matrix_expand(matrix *out,uint8_t *rho)

{
  undefined1 local_138 [8];
  BORINGSSL_keccak_st keccak_ctx;
  int j;
  int i;
  uint8_t input [34];
  uint8_t *rho_local;
  matrix *out_local;
  
  OPENSSL_memcpy(&j,rho,0x20);
  for (keccak_ctx.squeeze_offset._4_4_ = 0; keccak_ctx.squeeze_offset._4_4_ < 3;
      keccak_ctx.squeeze_offset._4_4_ = keccak_ctx.squeeze_offset._4_4_ + 1) {
    for (keccak_ctx.squeeze_offset._0_4_ = 0; (int)keccak_ctx.squeeze_offset < 3;
        keccak_ctx.squeeze_offset._0_4_ = (int)keccak_ctx.squeeze_offset + 1) {
      input[0x18] = (uint8_t)keccak_ctx.squeeze_offset._4_4_;
      input[0x19] = (uint8_t)(int)keccak_ctx.squeeze_offset;
      BORINGSSL_keccak_init((BORINGSSL_keccak_st *)local_138,boringssl_shake128);
      BORINGSSL_keccak_absorb((BORINGSSL_keccak_st *)local_138,(uint8_t *)&j,0x22);
      scalar_from_keccak_vartime
                (out->v[keccak_ctx.squeeze_offset._4_4_] + (int)keccak_ctx.squeeze_offset,
                 (BORINGSSL_keccak_st *)local_138);
    }
  }
  return;
}

Assistant:

static void matrix_expand(matrix *out, const uint8_t rho[32]) {
  uint8_t input[34];
  OPENSSL_memcpy(input, rho, 32);
  for (int i = 0; i < RANK; i++) {
    for (int j = 0; j < RANK; j++) {
      input[32] = i;
      input[33] = j;
      struct BORINGSSL_keccak_st keccak_ctx;
      BORINGSSL_keccak_init(&keccak_ctx, boringssl_shake128);
      BORINGSSL_keccak_absorb(&keccak_ctx, input, sizeof(input));
      scalar_from_keccak_vartime(&out->v[i][j], &keccak_ctx);
    }
  }
}